

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-knowledge.c
# Opt level: O1

void textui_browse_object_knowledge(char *name,wchar_t row)

{
  group_funcs g_funcs;
  member_funcs o_funcs;
  _Bool _Var1;
  int *obj_list;
  long lVar2;
  long lVar3;
  wchar_t o_count;
  ulong uVar4;
  
  obj_list = (int *)mem_zalloc((ulong)z_info->k_max << 2);
  if (z_info->k_max == 0) {
    o_count = L'\0';
  }
  else {
    uVar4 = 0;
    lVar3 = 0x29b;
    o_count = L'\0';
    do {
      if ((((k_info->flags[lVar3 + -0x80] != '\0') || (*(long *)((long)k_info + lVar3 + -0x1b) != 0)
           ) || ((player->opts).opt[0x1a] == true)) &&
         ((_Var1 = flag_has_dbg((bitflag *)((long)k_info + lVar3 + -0x216),2,4,"kind->kind_flags",
                                "KF_INSTA_ART"), !_Var1 &&
          (-1 < obj_group_order[*(int *)((long)k_info + lVar3 + -0x277)])))) {
        lVar2 = (long)o_count;
        o_count = o_count + L'\x01';
        obj_list[lVar2] = (int)uVar4;
      }
      uVar4 = uVar4 + 1;
      lVar3 = lVar3 + 0x2a0;
    } while (uVar4 < z_info->k_max);
  }
  g_funcs.gcomp = o_cmp_tval;
  g_funcs.name = kind_name;
  g_funcs.group = obj2gid;
  g_funcs.summary = (_func_void_wchar_t_wchar_t_ptr_wchar_t_wchar_t_wchar_t_wchar_t *)0x0;
  g_funcs.maxnum = L'$';
  g_funcs.easy_know = false;
  g_funcs._37_3_ = 0;
  o_funcs.lore = desc_obj_fake;
  o_funcs.display_member = display_object;
  o_funcs.xchar = o_xchar;
  o_funcs.xattr = o_xattr;
  o_funcs.xtra_prompt = o_xtra_prompt;
  o_funcs.xtra_act = o_xtra_act;
  o_funcs._48_8_ = 0;
  display_knowledge("known objects",obj_list,o_count,g_funcs,o_funcs,
                    "Ignore  Inscribed          Sym");
  mem_free(obj_list);
  return;
}

Assistant:

void textui_browse_object_knowledge(const char *name, int row)
{
	group_funcs kind_f = {kind_name, o_cmp_tval, obj2gid, 0, TV_MAX, false};
	member_funcs obj_f = {display_object, desc_obj_fake, o_xchar, o_xattr,
						  o_xtra_prompt, o_xtra_act, 0};

	int *objects;
	int o_count = 0;
	int i;
	struct object_kind *kind;

	objects = mem_zalloc(z_info->k_max * sizeof(int));

	for (i = 0; i < z_info->k_max; i++) {
		kind = &k_info[i];
		/* It's in the list if we've ever seen it, or it has a flavour,
		 * and it's not one of the special artifacts. This way the flavour
		 * appears in the list until it is found. */
		if ((kind->everseen || kind->flavor || OPT(player, cheat_xtra)) &&
			(!kf_has(kind->kind_flags, KF_INSTA_ART))) {
			int c = obj_group_order[k_info[i].tval];
			if (c >= 0) objects[o_count++] = i;
		}
	}

	display_knowledge("known objects", objects, o_count, kind_f, obj_f,
					  "Ignore  Inscribed          Sym");

	mem_free(objects);
}